

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

bool __thiscall llvm::Twine::isValid(Twine *this)

{
  bool bVar1;
  NodeKind NVar2;
  Twine *this_local;
  
  bVar1 = isNullary(this);
  if ((bVar1) && (NVar2 = getRHSKind(this), NVar2 != EmptyKind)) {
    this_local._7_1_ = false;
  }
  else {
    NVar2 = getRHSKind(this);
    if (NVar2 == NullKind) {
      this_local._7_1_ = false;
    }
    else {
      NVar2 = getRHSKind(this);
      if ((NVar2 == EmptyKind) || (NVar2 = getLHSKind(this), NVar2 != EmptyKind)) {
        NVar2 = getLHSKind(this);
        if ((NVar2 != TwineKind) || (bVar1 = isBinary((this->LHS).twine), bVar1)) {
          NVar2 = getRHSKind(this);
          if ((NVar2 != TwineKind) || (bVar1 = isBinary((this->RHS).twine), bVar1)) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool isValid() const {
      // Nullary twines always have Empty on the RHS.
      if (isNullary() && getRHSKind() != EmptyKind)
        return false;

      // Null should never appear on the RHS.
      if (getRHSKind() == NullKind)
        return false;

      // The RHS cannot be non-empty if the LHS is empty.
      if (getRHSKind() != EmptyKind && getLHSKind() == EmptyKind)
        return false;

      // A twine child should always be binary.
      if (getLHSKind() == TwineKind &&
          !LHS.twine->isBinary())
        return false;
      if (getRHSKind() == TwineKind &&
          !RHS.twine->isBinary())
        return false;

      return true;
    }